

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall
QGraphicsProxyWidget::inputMethodEvent(QGraphicsProxyWidget *this,QInputMethodEvent *event)

{
  bool bVar1;
  QGraphicsProxyWidgetPrivate *this_00;
  QWidget *pQVar2;
  QEvent *in_RSI;
  QWidget *focusWidget;
  QGraphicsProxyWidgetPrivate *d;
  
  this_00 = d_func((QGraphicsProxyWidget *)0x9be1bc);
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9be1d2);
  pQVar2 = QWidget::focusWidget((QWidget *)0x9be1da);
  if ((pQVar2 != (QWidget *)0x0) &&
     (bVar1 = QWidget::testAttribute((QWidget *)this_00,(WidgetAttribute)((ulong)pQVar2 >> 0x20)),
     bVar1)) {
    QCoreApplication::sendEvent(&pQVar2->super_QObject,in_RSI);
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::inputMethodEvent(QInputMethodEvent *event)
{
    // Forward input method events if the focus widget enables input methods.
    Q_D(const QGraphicsProxyWidget);
    QWidget *focusWidget = d->widget->focusWidget();
    if (focusWidget && focusWidget->testAttribute(Qt::WA_InputMethodEnabled))
        QCoreApplication::sendEvent(focusWidget, event);
}